

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O0

GLboolean __thiscall
glcts::TextureCubeMapArrayTextureSizeRTBase::checkResults
          (TextureCubeMapArrayTextureSizeRTBase *this,GLuint width,GLuint height,GLuint depth,
          STORAGE_TYPE storType)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *pTVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  char **local_430;
  char **local_388;
  uint local_35c;
  MessageBuilder local_358;
  uint local_1d8 [4];
  MessageBuilder local_1c8;
  GLuint local_48;
  STORAGE_TYPE local_44;
  GLuint read_size [4];
  GLboolean local_29;
  GLboolean test_passed;
  Functions *gl;
  STORAGE_TYPE storType_local;
  GLuint depth_local;
  GLuint height_local;
  GLuint width_local;
  TextureCubeMapArrayTextureSizeRTBase *this_local;
  long lVar4;
  
  storType_local = height;
  depth_local = width;
  _height_local = this;
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_TextureCubeMapArrayTextureSizeBase).super_TestCaseBase.m_context)
  ;
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  local_29 = '\x01';
  memset(&local_48,0,0x10);
  (**(code **)(lVar4 + 0x78))(0x8ca8,this->m_read_fbo_id);
  (**(code **)(lVar4 + 0x6a0))(0x8ca8,0x8ce0,0xde1,this->m_rt_std_id,0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Error attaching texture to frame buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x49f);
  checkFramebufferStatus(this,0x8ca8);
  (**(code **)(lVar4 + 0x1220))(0,0,1,1,0x8d99,0x1405,&local_48);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Error reading pixles from frame buffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x4a5);
  if (((local_48 != depth_local) || (local_44 != storType_local)) || (read_size[0] != depth / 6)) {
    pTVar5 = tcu::TestNode::getTestContext((TestNode *)this);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_1c8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_1c8,(char (*) [15])"Storage Type: ");
    if (storType == ST_MUTABLE) {
      local_388 = (char **)&mutableStorage;
    }
    else {
      local_388 = &imMutableStorage;
    }
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_388);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2b8f97b);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [103])
                               "textureSize() for samplerCubeArray returned wrong values of [width][height][layers]. They are equal to"
                       );
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2c316fc);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_48);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])"][");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_44);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])"][");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,read_size);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [17])"] but should be ");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2c316fc);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&depth_local);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])"][");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&storType_local);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])"][");
    local_1d8[0] = depth / 6;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_1d8);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2aea36f);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c8);
    local_29 = '\0';
  }
  (**(code **)(lVar4 + 0x6a0))(0x8ca8,0x8ce0,0xde1,this->m_rt_shw_id,0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Error attaching texture to frame buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x4b5);
  checkFramebufferStatus(this,0x8ca8);
  (**(code **)(lVar4 + 0x1220))(0,0,1,1,0x8d99,0x1405,&local_48);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Error reading pixles from frame buffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x4bb);
  if (((local_48 != depth_local) || (local_44 != storType_local)) || (read_size[0] != depth / 6)) {
    pTVar5 = tcu::TestNode::getTestContext((TestNode *)this);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_358,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_358,(char (*) [15])"Storage Type: ");
    if (storType == ST_MUTABLE) {
      local_430 = (char **)&mutableStorage;
    }
    else {
      local_430 = &imMutableStorage;
    }
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_430);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2b8f97b);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [109])
                               "textureSize() for samplerCubeArrayShadow returned wrong values of [width][height][layers]. They are equal to"
                       );
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2c316fc);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_48);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])"][");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_44);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])"][");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,read_size);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [17])"] but should be ");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2c316fc);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&depth_local);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])"][");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&storType_local);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])"][");
    local_35c = depth / 6;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_35c);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2aea36f);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_358);
    local_29 = '\0';
  }
  return local_29;
}

Assistant:

glw::GLboolean TextureCubeMapArrayTextureSizeRTBase::checkResults(glw::GLuint width, glw::GLuint height,
																  glw::GLuint depth, STORAGE_TYPE storType)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLboolean test_passed = true;

	glw::GLuint read_size[m_n_rt_components];
	memset(read_size, 0, m_n_rt_components * sizeof(glw::GLuint));

	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_read_fbo_id);

	/* Compare returned results of textureSize() called for samplerCubeArray sampler*/
	gl.framebufferTexture2D(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_rt_std_id, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error attaching texture to frame buffer");

	/* Check framebuffer status */
	checkFramebufferStatus(GL_READ_FRAMEBUFFER);

	gl.readPixels(0, 0, 1, 1, GL_RGBA_INTEGER, GL_UNSIGNED_INT, read_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error reading pixles from frame buffer!");

	if (read_size[0] != width || read_size[1] != height || read_size[2] != (depth / m_n_layers_per_cube))
	{
		getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "Storage Type: " << ((storType == ST_MUTABLE) ? mutableStorage : imMutableStorage) << "\n"
			<< "textureSize() for samplerCubeArray returned wrong values of [width][height][layers]. They are equal to"
			<< "[" << read_size[0] << "][" << read_size[1] << "][" << read_size[2] << "] but should be "
			<< "[" << width << "][" << height << "][" << depth / m_n_layers_per_cube << "]."
			<< tcu::TestLog::EndMessage;
		test_passed = false;
	}

	/* Compare returned results of textureSize() for samplerCubeArrayShadow sampler*/
	gl.framebufferTexture2D(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_rt_shw_id, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error attaching texture to frame buffer");

	/* Check framebuffer status */
	checkFramebufferStatus(GL_READ_FRAMEBUFFER);

	gl.readPixels(0, 0, 1, 1, GL_RGBA_INTEGER, GL_UNSIGNED_INT, read_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error reading pixles from frame buffer!");

	if (read_size[0] != width || read_size[1] != height || read_size[2] != (depth / m_n_layers_per_cube))
	{
		getTestContext().getLog() << tcu::TestLog::Message
								  << "Storage Type: " << ((storType == ST_MUTABLE) ? mutableStorage : imMutableStorage)
								  << "\n"
								  << "textureSize() for samplerCubeArrayShadow returned wrong values of "
									 "[width][height][layers]. They are equal to"
								  << "[" << read_size[0] << "][" << read_size[1] << "][" << read_size[2]
								  << "] but should be "
								  << "[" << width << "][" << height << "][" << depth / m_n_layers_per_cube << "]."
								  << tcu::TestLog::EndMessage;
		test_passed = false;
	}

	return test_passed;
}